

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O1

RC __thiscall QL_Manager::SetUpFirstNode(QL_Manager *this,QL_Node **topNode)

{
  char **ppcVar1;
  int iVar2;
  RelCatEntry *pRVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Condition condition;
  Condition *pCVar7;
  RC RVar8;
  RC RVar9;
  QL_NodeRel *this_00;
  int *attrs;
  long lVar10;
  mapped_type *pmVar11;
  Condition *pCVar12;
  QL_NodeSel *this_01;
  int attrlistSize;
  RC RVar13;
  bool bVar14;
  int index;
  int numConds;
  string relString;
  key_type local_78;
  uint local_74;
  uint local_70;
  int local_6c;
  int local_68;
  int local_64;
  QL_NodeRel *local_60;
  QL_Node **local_58;
  key_type local_50;
  
  this_00 = (QL_NodeRel *)operator_new(0x120);
  QL_NodeRel::QL_NodeRel(this_00,this,this->relEntries);
  *topNode = (QL_Node *)this_00;
  pRVar3 = this->relEntries;
  attrs = (int *)malloc((long)pRVar3->attrCount << 2);
  attrs[0] = 0;
  attrs[1] = 0;
  if (0 < pRVar3->attrCount) {
    lVar10 = 0;
    do {
      attrs[lVar10] = 0;
      lVar10 = lVar10 + 1;
    } while (lVar10 < pRVar3->attrCount);
  }
  std::__cxx11::string::string((string *)&local_50,pRVar3->relName,(allocator *)&local_68);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::operator[](&this->relToAttrIndex,&local_50);
  pRVar3 = this->relEntries;
  attrlistSize = pRVar3->attrCount;
  if (0 < attrlistSize) {
    iVar2 = *pmVar11;
    lVar10 = 0;
    do {
      attrs[lVar10] = iVar2 + (int)lVar10;
      lVar10 = lVar10 + 1;
      attrlistSize = pRVar3->attrCount;
    } while (lVar10 < attrlistSize);
  }
  QL_NodeRel::SetUpNode(this_00,attrs,attrlistSize);
  local_60 = this_00;
  local_58 = topNode;
  free(attrs);
  RVar13 = 0;
  RVar9 = 0;
  CountNumConditions(this,0,&local_68);
  local_78 = 0;
  if (0 < this->nConds) {
    local_64 = local_68;
    local_70 = 0;
    local_74 = 0;
    RVar9 = 0;
    do {
      pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&this->conditionToRel,&local_78);
      if (*pmVar11 == 0) {
        if (this->condptr[local_78].op == EQ_OP) {
          pCVar12 = this->condptr + local_78;
          bVar4 = false;
          if (((pCVar12->bRhsIsAttr != 0) || ((local_74 & 1) != 0)) || (this->isUpdate != false))
          goto LAB_0010fad7;
          local_6c = 0;
          RVar8 = GetAttrCatEntryPos(this,pCVar12->lhsAttr,&local_6c);
          if (RVar8 == 0) {
            bVar14 = this->attrEntries[local_6c].indexNo == -1;
            bVar4 = !bVar14;
            if (bVar14) {
              bVar14 = true;
            }
            else {
              RVar8 = (*(local_60->super_QL_Node)._vptr_QL_Node[8])();
              if (RVar8 != 0) goto LAB_0010fac2;
              local_74 = 1;
              bVar14 = true;
              bVar4 = true;
            }
          }
          else {
LAB_0010fac2:
            bVar14 = false;
            bVar4 = false;
            RVar9 = RVar8;
            RVar13 = RVar8;
          }
          if (bVar14) goto LAB_0010fad7;
          bVar4 = false;
        }
        else {
          bVar4 = false;
LAB_0010fad7:
          if ((!bVar4) && ((local_70 & 1) == 0)) {
            this_01 = (QL_NodeSel *)operator_new(0x58);
            QL_NodeSel::QL_NodeSel(this_01,this,&local_60->super_QL_Node);
            RVar9 = QL_NodeSel::SetUpNode(this_01,local_64);
            if (RVar9 != 0) {
              bVar4 = false;
              RVar13 = RVar9;
              goto LAB_0010fbe6;
            }
            *local_58 = (QL_Node *)this_01;
            local_70 = (uint)CONCAT71((int7)((ulong)local_58 >> 8),1);
            RVar9 = RVar13;
          }
          if (!bVar4) {
            pCVar12 = this->condptr;
            lVar10 = (long)local_78;
            pCVar7 = pCVar12 + lVar10;
            uVar5 = pCVar7->op;
            uVar6 = pCVar7->bRhsIsAttr;
            condition.bRhsIsAttr = uVar6;
            condition.op = uVar5;
            ppcVar1 = &pCVar12[lVar10].rhsAttr.attrName;
            condition.lhsAttr = pCVar12[lVar10].lhsAttr;
            condition.rhsAttr.relName = ((RelAttr *)(&pCVar7->op + 2))->relName;
            condition.rhsAttr.attrName = *ppcVar1;
            condition.rhsValue._0_8_ = ppcVar1[1];
            condition.rhsValue.data = pCVar12[lVar10].rhsValue.data;
            RVar8 = QL_Node::AddCondition(*local_58,condition,local_78);
            if (RVar8 != 0) {
              bVar4 = false;
              RVar9 = RVar8;
              RVar13 = RVar8;
              goto LAB_0010fbe6;
            }
          }
          bVar4 = true;
        }
LAB_0010fbe6:
        if (!bVar4) goto LAB_0010fc0c;
      }
      local_78 = local_78 + 1;
    } while (local_78 < this->nConds);
    RVar9 = 0;
  }
LAB_0010fc0c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return RVar9;
}

Assistant:

RC QL_Manager::SetUpFirstNode(QL_Node *&topNode){
  RC rc = 0;
  bool useSelNode = false; // whether a select node was used with this relation
  bool useIndex = false; // whether an index is being used on this relation
  int relIndex = 0; // take the first element of relEntries as the 1st relation

  QL_NodeRel *relNode = new QL_NodeRel(*this, relEntries);
  topNode = relNode;

  // Create the list of attributes associated with this relation
  int *attrList = (int *)malloc(relEntries[relIndex].attrCount * sizeof(int));
  memset((void *)attrList, 0, sizeof(attrList));
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = 0;
  }
  string relString(relEntries[relIndex].relName);
  int start = relToAttrIndex[relString];
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = start + i;
  }
  // Set up the relation node with this list of attributes
  relNode->SetUpNode(attrList, relEntries[relIndex].attrCount);
  free(attrList);

  // count the number of conditions associated with this node:
  int numConds;
  CountNumConditions(0, numConds);

  // For each of the conditions, add it to the relation
  for(int i = 0 ; i < nConds; i++){
    if(conditionToRel[i] == 0){
      bool added = false;
      // If it is a R.A=v condition, make the relation use index scan if there isn't already
      // an index, and if this isn't a update operation
      if(condptr[i].op == EQ_OP && !condptr[i].bRhsIsAttr && useIndex == false && isUpdate == false){
        int index = 0;
        if((rc = GetAttrCatEntryPos(condptr[i].lhsAttr, index) ))
          return (rc);
        if((attrEntries[index].indexNo != -1)){ // add only if there is an index on this attribute
          if((rc = relNode->UseIndex(index, attrEntries[index].indexNo, condptr[i].rhsValue.data) ))
            return (rc);
          added = true;
          useIndex = true;
        }
      }
      // Otherwise, create a select node and add the condition to the select node (or just add
      // if select node has already been created)
      if(! added && !useSelNode){
        QL_NodeSel *selNode = new QL_NodeSel(*this, *relNode);
        if((rc = selNode->SetUpNode(numConds) ))
          return (rc);
        topNode = selNode;
        useSelNode = true;
      }
      if(! added){
        if((rc = topNode->AddCondition(condptr[i], i) ))
          return (rc);
      }
    }
  }
  return (0);
}